

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall cmExtraKateGenerator::Generate(cmExtraKateGenerator *this)

{
  cmMakefile *this_00;
  bool bVar1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_01;
  const_reference ppcVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator local_f9;
  string local_f8;
  string local_d8;
  allocator local_b5 [20];
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  cmMakefile *local_20;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  cmExtraKateGenerator *this_local;
  
  lg = (cmLocalGenerator *)this;
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_01,0);
  mf = (cmMakefile *)*ppcVar2;
  local_20 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)mf);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_60,(cmLocalGenerator *)mf);
  this_00 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"CMAKE_BUILD_TYPE",&local_a1);
  pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,pcVar3,local_b5);
  pcVar3 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)mf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,pcVar3,&local_f9);
  GetPathBasename(&local_d8,this,&local_f8);
  GenerateProjectName(&local_40,this,&local_60,&local_80,&local_d8);
  std::__cxx11::string::operator=((string *)&this->ProjectName,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)local_b5);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string((string *)&local_60);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            ();
  bVar1 = std::operator==(&local_120,"Ninja");
  this->UseNinja = bVar1;
  std::__cxx11::string::~string((string *)&local_120);
  CreateKateProjectFile(this,(cmLocalGenerator *)mf);
  CreateDummyKateProjectFile(this,(cmLocalGenerator *)mf);
  return;
}

Assistant:

void cmExtraKateGenerator::Generate()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();
  this->ProjectName = this->GenerateProjectName(
    lg->GetProjectName(), mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
    this->GetPathBasename(lg->GetBinaryDirectory()));
  this->UseNinja = (this->GlobalGenerator->GetName() == "Ninja");

  this->CreateKateProjectFile(lg);
  this->CreateDummyKateProjectFile(lg);
}